

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::CombineUnions
          (cmCommandArgumentParserHelper *this,char *in1,char *in2)

{
  size_t sVar1;
  size_t sVar2;
  cmCommandArgumentParserHelper *local_38;
  char *out;
  size_t len;
  char *in2_local;
  char *in1_local;
  cmCommandArgumentParserHelper *this_local;
  
  this_local = (cmCommandArgumentParserHelper *)in2;
  if ((in1 != (char *)0x0) &&
     (this_local = (cmCommandArgumentParserHelper *)in1, in2 != (char *)0x0)) {
    len = (size_t)in2;
    in2_local = in1;
    in1_local = (char *)this;
    sVar1 = strlen(in1);
    sVar2 = strlen((char *)len);
    out = (char *)(sVar1 + sVar2 + 1);
    local_38 = (cmCommandArgumentParserHelper *)operator_new__((ulong)out);
    strcpy((char *)local_38,in2_local);
    strcat((char *)local_38,(char *)len);
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              (&this->Variables,(value_type *)&local_38);
    this_local = local_38;
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::CombineUnions(const char* in1,
                                                         const char* in2)
{
  if (!in1) {
    return in2;
  }
  if (!in2) {
    return in1;
  }
  size_t len = strlen(in1) + strlen(in2) + 1;
  char* out = new char[len];
  strcpy(out, in1);
  strcat(out, in2);
  this->Variables.push_back(out);
  return out;
}